

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O2

bool __thiscall RigidBodyDynamics::Joint::validate_spatial_axis(Joint *this,SpatialVector *axis)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar7 = (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar4 = (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar1 = (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar2 = (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar5 = (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  dVar4 = SQRT(dVar4 * dVar4 + dVar7 * dVar7 + dVar6 * dVar6);
  dVar6 = ABS(dVar4);
  dVar5 = SQRT(dVar5 * dVar5 + dVar2 * dVar2 + dVar1 * dVar1);
  dVar7 = ABS(dVar5);
  if ((1e-08 < dVar6) && (1e-08 < dVar4 + -1.0)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: joint rotation axis is not unit!");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if ((1e-08 < dVar7) && (1e-08 < dVar5 + -1.0)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: joint translation axis is not unit!");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return (bool)((-(1e-08 < dVar6) ^ -(1e-08 < dVar7)) & 1);
}

Assistant:

bool validate_spatial_axis (Math::SpatialVector &axis)
  {
#ifdef RBDL_USE_CASADI_MATH
      // If using casadi, the axes won't be validated
      return true;
#else
    bool axis_rotational = false;
    bool axis_translational = false;

    Math::Vector3d rotation (axis[0], axis[1], axis[2]);
    Math::Vector3d translation (axis[3], axis[4], axis[5]);

    if (fabs(rotation.norm()) > 1.0e-8) {
      axis_rotational = true;
    }

    if (fabs(translation.norm()) > 1.0e-8) {
      axis_translational = true;
    }

    if(axis_rotational && rotation.norm() - 1.0 > 1.0e-8) {
      std::cerr << "Warning: joint rotation axis is not unit!" << std::endl;
    }

    if(axis_translational && translation.norm() - 1.0 > 1.0e-8) {
      std::cerr << "Warning: joint translation axis is not unit!" << std::endl;
    }

    return axis_rotational != axis_translational;
#endif
  }